

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2266dc9::IFFT2DTest_Correctness_Test::TestBody(IFFT2DTest_Correctness_Test *this)

{
  float *pfVar1;
  undefined8 *puVar2;
  ParamType *pPVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  SEARCH_METHODS *pSVar7;
  uint uVar8;
  int iVar9;
  int n;
  vector<float,_std::allocator<float>_> expected;
  vector<float,_std::allocator<float>_> actual;
  AssertionResult gtest_ar_1;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> input_c;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int n_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  internal in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  pointer local_90;
  vector<float,_std::allocator<float>_> local_80;
  char local_68;
  undefined8 *local_60;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> local_58;
  ulong local_40;
  AssertHelper local_38;
  
  pPVar3 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  n_00 = pPVar3->n;
  local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 2;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&stack0xffffffffffffff68,"n","2",(int *)&stack0xffffffffffffff54,
             (int *)&local_80);
  if (in_stack_ffffffffffffff68 == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_90 == (pointer)0x0) {
      pSVar7 = "";
    }
    else {
      pSVar7 = *(SEARCH_METHODS **)local_90;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
               ,0xcd,(char *)pSVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)CONCAT44(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_80.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    if (local_90 == (pointer)0x0) {
      return;
    }
    if (*(pointer *)local_90 != local_90 + 4) {
      operator_delete(*(pointer *)local_90);
    }
  }
  else {
    if (local_90 != (pointer)0x0) {
      if (*(pointer *)local_90 != local_90 + 4) {
        operator_delete(*(pointer *)local_90);
      }
      operator_delete(local_90);
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff68,
               (ulong)(uint)(n_00 * n_00),(allocator_type *)&local_80);
    std::vector<float,_std::allocator<float>_>::vector
              (&local_80,(ulong)(uint)(n_00 * n_00),(allocator_type *)&local_58);
    if (0 < n_00) {
      uVar6 = 0;
      do {
        if (0 < n_00) {
          iVar5 = 0;
          local_40 = uVar6;
          do {
            ((float *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68))
            [n_00 * (int)uVar6 + iVar5] = 1.0;
            fft2d<float>(&local_58,
                         (float *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),n_00
                        );
            if (n_00 != 0) {
              pfVar1 = (this->super_IFFT2DTest).input_;
              uVar6 = 0;
              do {
                pfVar1[uVar6 * 2] =
                     *(float *)&local_58.
                                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_value;
                pfVar1[uVar6 * 2 + 1] =
                     *(float *)((long)&local_58.
                                       super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_value + 4
                               );
                uVar6 = uVar6 + 1;
              } while (n_00 * n_00 + (uint)(n_00 * n_00 == 0) != uVar6);
            }
            pPVar3 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
            (*pPVar3->ifft)((this->super_IFFT2DTest).input_,(this->super_IFFT2DTest).temp_,
                            (this->super_IFFT2DTest).output_);
            if (0 < n_00) {
              iVar9 = 0;
              do {
                if (0 < n_00) {
                  iVar4 = 0;
                  do {
                    testing::internal::DoubleNearPredFormat
                              (in_stack_ffffffffffffff48,(char *)0x760f17,
                               (char *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68)
                               ,(double)CONCAT44(iVar5,in_stack_ffffffffffffff60),
                               (double)in_stack_ffffffffffffff58._M_head_impl,
                               (double)CONCAT44(n_00,in_stack_ffffffffffffff50));
                    if (local_68 == '\0') {
                      testing::Message::Message((Message *)&stack0xffffffffffffff58);
                      pSVar7 = "";
                      if (local_60 != (undefined8 *)0x0) {
                        pSVar7 = (SEARCH_METHODS *)*local_60;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_38,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
                                 ,0xde,(char *)pSVar7);
                      testing::internal::AssertHelper::operator=
                                (&local_38,(Message *)&stack0xffffffffffffff58);
                      testing::internal::AssertHelper::~AssertHelper(&local_38);
                      if (in_stack_ffffffffffffff58._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)in_stack_ffffffffffffff58._M_head_impl + 8))();
                      }
                    }
                    puVar2 = local_60;
                    if (local_60 != (undefined8 *)0x0) {
                      if ((undefined8 *)*local_60 != local_60 + 2) {
                        operator_delete((undefined8 *)*local_60);
                      }
                      operator_delete(puVar2);
                    }
                    iVar4 = iVar4 + 1;
                  } while (iVar4 < n_00);
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < n_00);
            }
            uVar6 = local_40;
            *(undefined4 *)
             (CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68) +
             (long)(n_00 * (int)local_40 + iVar5) * 4) = 0;
            if (local_58.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.
                              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < n_00);
        }
        uVar8 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar8;
      } while ((int)uVar8 < n_00);
    }
    if ((void *)CONCAT44(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_80.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_80.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    local_90 = (pointer)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68);
    if (local_90 == (pointer)0x0) {
      return;
    }
  }
  operator_delete(local_90);
  return;
}

Assistant:

TEST_P(IFFT2DTest, Correctness) {
  int n = GetParam().n;
  ASSERT_GE(n, 2);
  std::vector<float> expected(n * n);
  std::vector<float> actual(n * n);
  // Do forward transform then invert to make sure we get back expected
  for (int y = 0; y < n; ++y) {
    for (int x = 0; x < n; ++x) {
      expected[y * n + x] = 1;
      std::vector<std::complex<float> > input_c = fft2d(&expected[0], n);
      for (int i = 0; i < n * n; ++i) {
        input_[2 * i + 0] = input_c[i].real();
        input_[2 * i + 1] = input_c[i].imag();
      }
      GetParam().ifft(&input_[0], &temp_[0], &output_[0]);

      for (int yy = 0; yy < n; ++yy) {
        for (int xx = 0; xx < n; ++xx) {
          EXPECT_NEAR(expected[yy * n + xx], output_[yy * n + xx] / (n * n),
                      1e-5);
        }
      }
      expected[y * n + x] = 0;
    }
  }
}